

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ares_conn.c
# Opt level: O0

ares_conn_err_t ares_conn_read(ares_conn_t *conn,void *data,size_t len,size_t *read_bytes)

{
  ares_channel_t *channel_00;
  ares_bool_t aVar1;
  ares_socklen_t local_bc;
  undefined1 local_b8 [4];
  ares_socklen_t salen;
  sockaddr_storage sa_storage;
  ares_conn_err_t err;
  ares_channel_t *channel;
  size_t *read_bytes_local;
  size_t len_local;
  void *data_local;
  ares_conn_t *conn_local;
  
  channel_00 = conn->server->channel;
  if ((conn->flags & ARES_CONN_FLAG_TCP) == ARES_CONN_FLAG_NONE) {
    local_bc = 0x80;
    memset(local_b8,0,0x80);
    sa_storage.__ss_align._4_4_ =
         ares_socket_recvfrom
                   (channel_00,conn->fd,ARES_FALSE,data,len,0,(sockaddr *)local_b8,&local_bc,
                    read_bytes);
    if ((sa_storage.__ss_align._4_4_ == ARES_CONN_ERR_SUCCESS) &&
       (aVar1 = ares_sockaddr_addr_eq((sockaddr *)local_b8,&conn->server->addr), aVar1 == ARES_FALSE
       )) {
      sa_storage.__ss_align._4_4_ = ARES_CONN_ERR_WOULDBLOCK;
    }
  }
  else {
    sa_storage.__ss_align._4_4_ =
         ares_socket_recv(channel_00,conn->fd,ARES_TRUE,data,len,read_bytes);
  }
  if (sa_storage.__ss_align._4_4_ == ARES_CONN_ERR_SUCCESS) {
    conn->state_flags = conn->state_flags | ARES_CONN_STATE_CONNECTED;
  }
  return sa_storage.__ss_align._4_4_;
}

Assistant:

ares_conn_err_t ares_conn_read(ares_conn_t *conn, void *data, size_t len,
                               size_t *read_bytes)
{
  ares_channel_t *channel = conn->server->channel;
  ares_conn_err_t err;

  if (!(conn->flags & ARES_CONN_FLAG_TCP)) {
    struct sockaddr_storage sa_storage;
    ares_socklen_t          salen = sizeof(sa_storage);

    memset(&sa_storage, 0, sizeof(sa_storage));

    err =
      ares_socket_recvfrom(channel, conn->fd, ARES_FALSE, data, len, 0,
                           (struct sockaddr *)&sa_storage, &salen, read_bytes);

#ifdef HAVE_RECVFROM
    if (err == ARES_CONN_ERR_SUCCESS &&
        !ares_sockaddr_addr_eq((struct sockaddr *)&sa_storage,
                               &conn->server->addr)) {
      err = ARES_CONN_ERR_WOULDBLOCK;
    }
#endif
  } else {
    err = ares_socket_recv(channel, conn->fd, ARES_TRUE, data, len, read_bytes);
  }

  /* Toggle connected state if needed */
  if (err == ARES_CONN_ERR_SUCCESS) {
    conn->state_flags |= ARES_CONN_STATE_CONNECTED;
  }

  return err;
}